

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControlPrivate::commitPreedit(QWidgetTextControlPrivate *this)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isPreediting(this);
  if (bVar1) {
    QGuiApplication::inputMethod();
    QInputMethod::commit();
    bVar1 = isPreediting(this);
    if (bVar1) {
      QTextCursor::beginEditBlock();
      this->preeditCursor = 0;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::block();
      iVar2 = QTextBlock::layout();
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      local_58.size = 0;
      QTextLayout::setPreeditArea(iVar2,(QString *)0xffffffffffffffff);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QTextLayout::clearFormats();
      QTextCursor::endEditBlock();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::commitPreedit()
{
    if (!isPreediting())
        return;

    QGuiApplication::inputMethod()->commit();

    if (!isPreediting())
        return;

    cursor.beginEditBlock();
    preeditCursor = 0;
    QTextBlock block = cursor.block();
    QTextLayout *layout = block.layout();
    layout->setPreeditArea(-1, QString());
    layout->clearFormats();
    cursor.endEditBlock();
}